

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JobResults.cpp
# Opt level: O0

void __thiscall
xmrig::JobResultsPrivate::submit(JobResultsPrivate *this,Job *job,uint32_t *results,size_t count)

{
  list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> *in_RCX;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  unsigned_long *in_stack_ffffffffffffffc8;
  uint **in_stack_ffffffffffffffd0;
  Job *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffb8);
  std::__cxx11::list<xmrig::JobBundle,std::allocator<xmrig::JobBundle>>::
  emplace_back<xmrig::Job_const&,unsigned_int*&,unsigned_long&>
            (in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  uv_async_send(in_RDI[10]._M_device);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2330c9);
  return;
}

Assistant:

inline void submit(const Job &job, uint32_t *results, size_t count)
    {
        std::lock_guard<std::mutex> lock(m_mutex);
        m_bundles.emplace_back(job, results, count);

        uv_async_send(m_async);
    }